

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O0

bool __thiscall DLoadMenu::MenuEvent(DLoadMenu *this,int mkey,bool fromcontroller)

{
  bool bVar1;
  uint uVar2;
  FSaveGameNode **ppFVar3;
  char *name;
  bool fromcontroller_local;
  int mkey_local;
  DLoadMenu *this_local;
  
  bVar1 = DLoadSaveMenu::MenuEvent(&this->super_DLoadSaveMenu,mkey,fromcontroller);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    if (((this->super_DLoadSaveMenu).Selected != -1) &&
       (uVar2 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&DLoadSaveMenu::SaveGames),
       uVar2 != 0)) {
      if (mkey == 6) {
        ppFVar3 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::operator[]
                            (&DLoadSaveMenu::SaveGames,(long)(this->super_DLoadSaveMenu).Selected);
        name = FString::GetChars(&(*ppFVar3)->Filename);
        G_LoadGame(name,true);
        if (quickSaveSlot == (FSaveGameNode *)0x1) {
          ppFVar3 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::operator[]
                              (&DLoadSaveMenu::SaveGames,(long)(this->super_DLoadSaveMenu).Selected)
          ;
          quickSaveSlot = *ppFVar3;
        }
        M_ClearMenus();
        V_SetBorderNeedRefresh();
        DLoadSaveMenu::LastAccessed = (this->super_DLoadSaveMenu).Selected;
        return true;
      }
      return false;
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DLoadMenu::MenuEvent (int mkey, bool fromcontroller)
{
	if (Super::MenuEvent(mkey, fromcontroller)) 
	{
		return true;
	}
	if (Selected == -1 || SaveGames.Size() == 0)
	{
		return false;
	}

	if (mkey == MKEY_Enter)
	{
		G_LoadGame (SaveGames[Selected]->Filename.GetChars(), true);
		if (quickSaveSlot == (FSaveGameNode*)1)
		{
			quickSaveSlot = SaveGames[Selected];
		}
		M_ClearMenus();
		V_SetBorderNeedRefresh();
		LastAccessed = Selected;
		return true;
	}
	return false;
}